

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3SectorSize(sqlite3_file *pFile)

{
  undefined4 local_14;
  int iRet;
  sqlite3_file *pFile_local;
  
  local_14 = sqlite3OsSectorSize(pFile);
  if (local_14 < 0x20) {
    local_14 = 0x200;
  }
  else if (0x10000 < local_14) {
    local_14 = 0x10000;
  }
  return local_14;
}

Assistant:

SQLITE_PRIVATE int sqlite3SectorSize(sqlite3_file *pFile){
  int iRet = sqlite3OsSectorSize(pFile);
  if( iRet<32 ){
    iRet = 512;
  }else if( iRet>MAX_SECTOR_SIZE ){
    assert( MAX_SECTOR_SIZE>=512 );
    iRet = MAX_SECTOR_SIZE;
  }
  return iRet;
}